

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  string *in_RSI;
  value_type *in_RDI;
  size_t pos;
  Token token;
  Token *in_stack_fffffffffffffe38;
  Token *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_fffffffffffffe50;
  string local_188 [32];
  Token local_168;
  string local_140 [32];
  string local_120 [32];
  undefined1 local_100 [104];
  string local_98 [88];
  int local_40;
  string local_38 [56];
  
  while (bVar1 = std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    Token::Token(in_stack_fffffffffffffe40,(Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (string *)0x1d4c8a);
    std::__cxx11::string::operator=(in_RSI,"");
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 == '-') {
      uVar3 = std::__cxx11::string::size();
      if ((uVar3 < 2) ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar2 != '-')) {
        std::__cxx11::string::substr((ulong)(local_100 + 0x20),(ulong)local_38);
        Token::Token(in_stack_fffffffffffffe40,(Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                     (string *)0x1d4dfa);
        Token::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        Token::~Token((Token *)0x1d4e1e);
        std::__cxx11::string::~string((string *)(local_100 + 0x20));
        uVar3 = std::__cxx11::string::size();
        if (1 < uVar3) {
          in_stack_fffffffffffffe48 = in_RDI;
          in_stack_fffffffffffffe50 =
               (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
               std::__cxx11::string::operator[]((ulong)local_38);
          lVar4 = std::__cxx11::string::find
                            ((char)in_stack_fffffffffffffe48,
                             (ulong)(uint)(int)*(char *)&(in_stack_fffffffffffffe50->
                                                                                                                  
                                                  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
          if (lVar4 == -1) {
            std::__cxx11::string::substr((ulong)local_120,(ulong)local_38);
            std::operator+((char *)in_stack_fffffffffffffe48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe40);
            in_stack_fffffffffffffe40 = (Token *)local_100;
            std::__cxx11::string::operator=(in_RSI,(string *)in_stack_fffffffffffffe40);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffffe40);
            std::__cxx11::string::~string(local_120);
            std::__cxx11::string::substr((ulong)local_140,(ulong)local_38);
            std::__cxx11::string::operator=(local_38,local_140);
            std::__cxx11::string::~string(local_140);
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
        Token::Token(in_stack_fffffffffffffe40,(Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                     (string *)0x1d4d48);
        Token::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        Token::~Token((Token *)0x1d4d6c);
        std::__cxx11::string::~string(local_98);
      }
    }
    if ((local_40 != 0) &&
       (local_168._32_8_ = std::__cxx11::string::find_first_of(local_38,(ulong)in_RDI),
       local_168._32_8_ != -1)) {
      std::__cxx11::string::substr((ulong)&local_168,(ulong)local_38);
      in_stack_fffffffffffffe38 = &local_168;
      std::__cxx11::string::operator=(in_RSI,(string *)in_stack_fffffffffffffe38);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffe38);
      std::__cxx11::string::substr((ulong)local_188,(ulong)local_38);
      std::__cxx11::string::operator=(local_38,local_188);
      std::__cxx11::string::~string(local_188);
    }
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    Token::~Token((Token *)0x1d5077);
  }
  return;
}

Assistant:

void parseIntoTokens( std::string arg, std::vector<Parser::Token>& tokens ) const {
            while( !arg.empty() ) {
                Parser::Token token( Parser::Token::Positional, arg );
                arg = "";
                if( token.data[0] == '-' ) {
                    if( token.data.size() > 1 && token.data[1] == '-' ) {
                        token = Parser::Token( Parser::Token::LongOpt, token.data.substr( 2 ) );
                    }
                    else {
                        token = Parser::Token( Parser::Token::ShortOpt, token.data.substr( 1 ) );
                        if( token.data.size() > 1 && separators.find( token.data[1] ) == std::string::npos ) {
                            arg = "-" + token.data.substr( 1 );
                            token.data = token.data.substr( 0, 1 );
                        }
                    }
                }
                if( token.type != Parser::Token::Positional ) {
                    std::size_t pos = token.data.find_first_of( separators );
                    if( pos != std::string::npos ) {
                        arg = token.data.substr( pos+1 );
                        token.data = token.data.substr( 0, pos );
                    }
                }
                tokens.push_back( token );
            }
        }